

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_radix_sort.h
# Opt level: O0

uint * crnlib::indirect_radix_sort<unsigned_int,unsigned_short>
                 (uint num_indices,uint *pIndices0,uint *pIndices1,unsigned_short *pKeys,
                 uint key_ofs,uint key_size,bool init_indices)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  byte bVar8;
  long in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  uint *t;
  uint dst_offset;
  uint c;
  uint index;
  uint dst_offset1;
  uint dst_offset0_1;
  uint dst_offset0;
  uint c1;
  uint c0;
  uint index1;
  uint index0;
  uint *q_5;
  uint *p_5;
  uint pass_shift;
  uint i_1;
  uint cur_ofs;
  uint offsets [256];
  uint *pHist;
  uint pass;
  uint *pNew;
  uint *pCur;
  uint key_3;
  uint key1_1;
  uint key0_1;
  uint *q_4;
  uint *p_4;
  uint key_2;
  uint key1;
  uint key0;
  uint *q_3;
  uint *p_3;
  uint key_1;
  uint *q_2;
  uint *p_2;
  uint key;
  uint *q_1;
  uint *p_1;
  uint hist [1024];
  uint i;
  uint *q;
  uint *p;
  uint *local_1500;
  uint local_14f0;
  uint local_14ec;
  uint auStack_14e8 [256];
  int *local_10e8;
  uint local_10dc;
  uint *local_10d8;
  uint *local_10d0;
  uint local_10c4;
  uint local_10c0;
  uint local_10bc;
  uint *local_10b8;
  uint *local_10b0;
  uint local_10a4;
  uint local_10a0;
  uint local_109c;
  uint *local_1098;
  uint *local_1090;
  uint local_1084;
  uint *local_1080;
  uint *local_1078;
  uint local_106c;
  uint *local_1068;
  uint *local_1060;
  int local_1058 [1027];
  uint local_4c;
  uint *local_48;
  uint *local_40;
  byte local_31;
  uint local_30;
  uint local_2c;
  long local_28;
  uint *local_20;
  uint *local_18;
  uint local_c;
  
  local_31 = (byte)dst_offset & 1;
  if (local_31 != 0) {
    local_48 = in_RSI + (in_EDI & 0xfffffffe);
    local_4c = 0;
    for (local_40 = in_RSI; local_40 != local_48; local_40 = local_40 + 2) {
      *local_40 = local_4c;
      local_40[1] = local_4c + 1;
      local_4c = local_4c + 2;
    }
    if ((in_EDI & 1) != 0) {
      *local_40 = local_4c;
    }
  }
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_EDI;
  memset(local_1058,0,(ulong)in_R9D << 10);
  if (local_30 == 4) {
    local_1068 = local_18 + local_c;
    for (local_1060 = local_18; local_1060 != local_18 + local_c; local_1060 = local_1060 + 1) {
      local_106c = *(uint *)(local_28 + (ulong)*local_1060 * 2 + (ulong)local_2c);
      local_1058[local_106c & 0xff] = local_1058[local_106c & 0xff] + 1;
      uVar3 = (local_106c >> 8 & 0xff) + 0x100;
      local_1058[uVar3] = local_1058[uVar3] + 1;
      uVar3 = (local_106c >> 0x10 & 0xff) + 0x200;
      local_1058[uVar3] = local_1058[uVar3] + 1;
      uVar3 = (local_106c >> 0x18) + 0x300;
      local_1058[uVar3] = local_1058[uVar3] + 1;
    }
  }
  else if (local_30 == 3) {
    local_1080 = local_18 + local_c;
    for (local_1078 = local_18; local_1078 != local_18 + local_c; local_1078 = local_1078 + 1) {
      local_1084 = *(uint *)(local_28 + (ulong)*local_1078 * 2 + (ulong)local_2c);
      local_1058[local_1084 & 0xff] = local_1058[local_1084 & 0xff] + 1;
      uVar3 = (local_1084 >> 8 & 0xff) + 0x100;
      local_1058[uVar3] = local_1058[uVar3] + 1;
      uVar3 = (local_1084 >> 0x10 & 0xff) + 0x200;
      local_1058[uVar3] = local_1058[uVar3] + 1;
    }
  }
  else if (local_30 == 2) {
    local_1098 = local_18 + (local_c & 0xfffffffe);
    for (local_1090 = local_18; local_1090 != local_18 + (local_c & 0xfffffffe);
        local_1090 = local_1090 + 2) {
      local_109c = *(uint *)(local_28 + (ulong)*local_1090 * 2 + (ulong)local_2c);
      local_10a0 = *(uint *)(local_28 + (ulong)local_1090[1] * 2 + (ulong)local_2c);
      local_1058[local_109c & 0xff] = local_1058[local_109c & 0xff] + 1;
      uVar3 = (local_109c >> 8 & 0xff) + 0x100;
      local_1058[uVar3] = local_1058[uVar3] + 1;
      local_1058[local_10a0 & 0xff] = local_1058[local_10a0 & 0xff] + 1;
      uVar3 = (local_10a0 >> 8 & 0xff) + 0x100;
      local_1058[uVar3] = local_1058[uVar3] + 1;
    }
    if ((local_c & 1) != 0) {
      local_10a4 = *(uint *)(local_28 + (ulong)*local_1090 * 2 + (ulong)local_2c);
      local_1058[local_10a4 & 0xff] = local_1058[local_10a4 & 0xff] + 1;
      uVar3 = (local_10a4 >> 8 & 0xff) + 0x100;
      local_1058[uVar3] = local_1058[uVar3] + 1;
    }
  }
  else {
    if (local_30 != 1) {
      return (uint *)0x0;
    }
    local_10b8 = local_18 + (local_c & 0xfffffffe);
    for (local_10b0 = local_18; local_10b0 != local_18 + (local_c & 0xfffffffe);
        local_10b0 = local_10b0 + 2) {
      local_10bc = *(uint *)(local_28 + (ulong)*local_10b0 * 2 + (ulong)local_2c);
      local_10c0 = *(uint *)(local_28 + (ulong)local_10b0[1] * 2 + (ulong)local_2c);
      local_10bc = local_10bc & 0xff;
      local_1058[local_10bc] = local_1058[local_10bc] + 1;
      local_10c0 = local_10c0 & 0xff;
      local_1058[local_10c0] = local_1058[local_10c0] + 1;
    }
    if ((local_c & 1) != 0) {
      local_10c4 = *(uint *)(local_28 + (ulong)*local_10b0 * 2 + (ulong)local_2c);
      local_10c4 = local_10c4 & 0xff;
      local_1058[local_10c4] = local_1058[local_10c4] + 1;
    }
  }
  local_10d0 = local_18;
  local_10d8 = local_20;
  for (local_10dc = 0; local_10dc < local_30; local_10dc = local_10dc + 1) {
    local_10e8 = local_1058 + (local_10dc << 8);
    local_14ec = 0;
    for (local_14f0 = 0; local_14f0 < 0x100; local_14f0 = local_14f0 + 2) {
      auStack_14e8[local_14f0] = local_14ec;
      iVar4 = local_10e8[local_14f0];
      auStack_14e8[local_14f0 + 1] = iVar4 + local_14ec;
      local_14ec = local_10e8[local_14f0 + 1] + iVar4 + local_14ec;
    }
    iVar4 = local_10dc << 3;
    puVar7 = local_10d0 + (local_c & 0xfffffffe);
    for (local_1500 = local_10d0; bVar8 = (byte)iVar4, local_1500 != puVar7;
        local_1500 = local_1500 + 2) {
      uVar3 = *local_1500;
      uVar1 = local_1500[1];
      uVar5 = *(uint *)(local_28 + (ulong)uVar3 * 2 + (ulong)local_2c) >> (bVar8 & 0x1f) & 0xff;
      uVar6 = *(uint *)(local_28 + (ulong)uVar1 * 2 + (ulong)local_2c) >> (bVar8 & 0x1f) & 0xff;
      if (uVar5 == uVar6) {
        uVar6 = auStack_14e8[uVar5];
        auStack_14e8[uVar5] = uVar6 + 2;
        local_10d8[uVar6] = uVar3;
        local_10d8[uVar6 + 1] = uVar1;
      }
      else {
        uVar2 = auStack_14e8[uVar5];
        auStack_14e8[uVar5] = uVar2 + 1;
        uVar5 = auStack_14e8[uVar6];
        auStack_14e8[uVar6] = uVar5 + 1;
        local_10d8[uVar2] = uVar3;
        local_10d8[uVar5] = uVar1;
      }
    }
    if ((local_c & 1) != 0) {
      uVar3 = *local_1500;
      uVar5 = *(uint *)(local_28 + (ulong)uVar3 * 2 + (ulong)local_2c) >> (bVar8 & 0x1f) & 0xff;
      uVar1 = auStack_14e8[uVar5];
      auStack_14e8[uVar5] = uVar1 + 1;
      local_10d8[uVar1] = uVar3;
    }
    puVar7 = local_10d0;
    local_10d0 = local_10d8;
    local_10d8 = puVar7;
  }
  return local_10d0;
}

Assistant:

T* indirect_radix_sort(uint num_indices, T* pIndices0, T* pIndices1, const Q* pKeys, uint key_ofs, uint key_size, bool init_indices) {
  CRNLIB_ASSERT_OPEN_RANGE(key_ofs, 0, sizeof(T));
  CRNLIB_ASSERT_CLOSED_RANGE(key_size, 1, 4);

  if (init_indices) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;
    uint i;
    for (i = 0; p != q; p += 2, i += 2) {
      p[0] = static_cast<T>(i);
      p[1] = static_cast<T>(i + 1);
    }

    if (num_indices & 1)
      *p = static_cast<T>(i);
  }

  uint hist[256 * 4];

  memset(hist, 0, sizeof(hist[0]) * 256 * key_size);

#define CRNLIB_GET_KEY(p) (*(const uint*)((const uint8*)(pKeys + *(p)) + key_ofs))
#define CRNLIB_GET_KEY_FROM_INDEX(i) (*(const uint*)((const uint8*)(pKeys + (i)) + key_ofs))

  if (key_size == 4) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
      hist[768 + ((key >> 24) & 0xFF)]++;
    }
  } else if (key_size == 3) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
    }
  } else if (key_size == 2) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[256 + ((key0 >> 8) & 0xFF)]++;

      hist[key1 & 0xFF]++;
      hist[256 + ((key1 >> 8) & 0xFF)]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
    }
  } else {
    CRNLIB_ASSERT(key_size == 1);
    if (key_size != 1)
      return NULL;

    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[key1 & 0xFF]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
    }
  }

  T* pCur = pIndices0;
  T* pNew = pIndices1;

  for (uint pass = 0; pass < key_size; pass++) {
    const uint* pHist = &hist[pass << 8];

    uint offsets[256];

    uint cur_ofs = 0;
    for (uint i = 0; i < 256; i += 2) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];

      offsets[i + 1] = cur_ofs;
      cur_ofs += pHist[i + 1];
    }

    const uint pass_shift = pass << 3;

    T* p = pCur;
    T* q = pCur + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      uint index0 = p[0];
      uint index1 = p[1];

      uint c0 = (CRNLIB_GET_KEY_FROM_INDEX(index0) >> pass_shift) & 0xFF;
      uint c1 = (CRNLIB_GET_KEY_FROM_INDEX(index1) >> pass_shift) & 0xFF;

      if (c0 == c1) {
        uint dst_offset0 = offsets[c0];

        offsets[c0] = dst_offset0 + 2;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset0 + 1] = static_cast<T>(index1);
      } else {
        uint dst_offset0 = offsets[c0]++;
        uint dst_offset1 = offsets[c1]++;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset1] = static_cast<T>(index1);
      }
    }

    if (num_indices & 1) {
      uint index = *p;
      uint c = (CRNLIB_GET_KEY_FROM_INDEX(index) >> pass_shift) & 0xFF;

      uint dst_offset = offsets[c];
      offsets[c] = dst_offset + 1;

      pNew[dst_offset] = static_cast<T>(index);
    }

    T* t = pCur;
    pCur = pNew;
    pNew = t;
  }

  return pCur;
}